

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O0

bool __thiscall DyndepLoader::LoadDyndeps(DyndepLoader *this,Node *node,DyndepFile *ddf,string *err)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  reference ppEVar3;
  pointer ppVar4;
  pointer ppVar5;
  string *psVar6;
  reference ppNVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  Edge *local_120;
  Edge *edge_1;
  _Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> local_110;
  iterator local_108;
  _Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> local_100;
  const_iterator oe_1;
  Dyndeps *dyndeps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Self local_60;
  _Self local_58;
  iterator ddi;
  Edge *edge;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_40;
  const_iterator oe;
  vector<Edge_*,_std::allocator<Edge_*>_> *out_edges;
  string *err_local;
  DyndepFile *ddf_local;
  Node *node_local;
  DyndepLoader *this_local;
  
  Node::set_dyndep_pending(node,false);
  __stream = _stderr;
  if ((g_explaining & 1U) != 0) {
    Node::path_abi_cxx11_(node);
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"ninja explain: loading dyndep file \'%s\'\n",uVar2);
  }
  bVar1 = LoadDyndepFile(this,node,ddf,err);
  if (bVar1) {
    oe._M_current = (Edge **)Node::out_edges(node);
    local_40._M_current =
         (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)oe._M_current);
    while( true ) {
      edge = (Edge *)std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                               ((vector<Edge_*,_std::allocator<Edge_*>_> *)oe._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)&edge);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_40);
      ddi._M_node = (_Base_ptr)*ppEVar3;
      if (((Edge *)ddi._M_node)->dyndep_ == node) {
        local_58._M_node =
             (_Base_ptr)
             std::
             map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
             ::find(&ddf->
                     super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                    ,(key_type *)&ddi);
        local_60._M_node =
             (_Base_ptr)
             std::
             map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
             ::end(&ddf->
                    super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                  );
        bVar1 = std::operator==(&local_58,&local_60);
        if (bVar1) {
          ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)&ddi._M_node[1]._M_parent,
                               0);
          psVar6 = Node::path_abi_cxx11_(*ppNVar7);
          std::operator+(&local_e0,"\'",psVar6);
          std::operator+(&local_c0,&local_e0,"\' not mentioned in its dyndep file \'");
          psVar6 = Node::path_abi_cxx11_(node);
          std::operator+(&local_a0,&local_c0,psVar6);
          std::operator+(&local_80,&local_a0,"\'");
          std::__cxx11::string::operator=((string *)err,(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_e0);
          return false;
        }
        ppVar4 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->(&local_58);
        (ppVar4->second).used_ = true;
        ppVar4 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->(&local_58);
        oe_1._M_node = (_Base_ptr)&ppVar4->second;
        bVar1 = UpdateEdge(this,(Edge *)ddi._M_node,(Dyndeps *)oe_1._M_node,err);
        if (!bVar1) {
          return false;
        }
      }
      __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_40);
    }
    local_108._M_node =
         (_Base_ptr)
         std::
         map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
         ::begin(&ddf->
                  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                );
    std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::_Rb_tree_const_iterator
              (&local_100,&local_108);
    while( true ) {
      edge_1 = (Edge *)std::
                       map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                       ::end(&ddf->
                              super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                            );
      std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::_Rb_tree_const_iterator
                (&local_110,(iterator *)&edge_1);
      bVar1 = std::operator!=(&local_100,&local_110);
      if (!bVar1) break;
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->
                         (&local_100);
      if (((ppVar5->second).used_ & 1U) == 0) {
        ppVar5 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->
                           (&local_100);
        local_120 = ppVar5->first;
        psVar6 = Node::path_abi_cxx11_(node);
        std::operator+(&local_1a0,"dyndep file \'",psVar6);
        std::operator+(&local_180,&local_1a0,"\' mentions output \'");
        ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_120->outputs_,0);
        psVar6 = Node::path_abi_cxx11_(*ppNVar7);
        std::operator+(&local_160,&local_180,psVar6);
        std::operator+(&local_140,&local_160,
                       "\' whose build statement does not have a dyndep binding for the file");
        std::__cxx11::string::operator=((string *)err,(string *)&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        return false;
      }
      std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator++(&local_100);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DyndepLoader::LoadDyndeps(Node* node, DyndepFile* ddf,
                               std::string* err) const {
  // We are loading the dyndep file now so it is no longer pending.
  node->set_dyndep_pending(false);

  // Load the dyndep information from the file.
  EXPLAIN("loading dyndep file '%s'", node->path().c_str());
  if (!LoadDyndepFile(node, ddf, err))
    return false;

  // Update each edge that specified this node as its dyndep binding.
  std::vector<Edge*> const& out_edges = node->out_edges();
  for (std::vector<Edge*>::const_iterator oe = out_edges.begin();
       oe != out_edges.end(); ++oe) {
    Edge* const edge = *oe;
    if (edge->dyndep_ != node)
      continue;

    DyndepFile::iterator ddi = ddf->find(edge);
    if (ddi == ddf->end()) {
      *err = ("'" + edge->outputs_[0]->path() + "' "
              "not mentioned in its dyndep file "
              "'" + node->path() + "'");
      return false;
    }

    ddi->second.used_ = true;
    Dyndeps const& dyndeps = ddi->second;
    if (!UpdateEdge(edge, &dyndeps, err)) {
      return false;
    }
  }

  // Reject extra outputs in dyndep file.
  for (DyndepFile::const_iterator oe = ddf->begin(); oe != ddf->end();
       ++oe) {
    if (!oe->second.used_) {
      Edge* const edge = oe->first;
      *err = ("dyndep file '" + node->path() + "' mentions output "
              "'" + edge->outputs_[0]->path() + "' whose build statement "
              "does not have a dyndep binding for the file");
      return false;
    }
  }

  return true;
}